

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_affine.cpp
# Opt level: O3

trans_affine * __thiscall
agg::trans_affine::parl_to_rect
          (trans_affine *this,double *parl,double x1,double y1,double x2,double y2)

{
  double dst [6];
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_38 = x1;
  local_30 = y1;
  local_28 = x2;
  local_20 = y1;
  local_18 = x2;
  local_10 = y2;
  parl_to_parl(this,parl,&local_38);
  return this;
}

Assistant:

const trans_affine& trans_affine::parl_to_rect(const double* parl, 
                                                   double x1, double y1, 
                                                   double x2, double y2)
    {
        double dst[6];
        dst[0] = x1; dst[1] = y1;
        dst[2] = x2; dst[3] = y1;
        dst[4] = x2; dst[5] = y2;
        parl_to_parl(parl, dst);
        return *this;
    }